

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void fs_write_multiple_bufs(int add_flags)

{
  int iVar1;
  __off64_t _Var2;
  undefined1 auVar3 [16];
  uv_buf_t uVar4;
  undefined8 uStack_38;
  int r;
  uv_buf_t iovs [2];
  int add_flags_local;
  
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_open(0,&open_req1,"test_file",add_flags | 0x41,0x180);
  if (iVar1 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xbcd,"r >= 0");
    abort();
  }
  if (open_req1.result < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xbce,"open_req1.result >= 0");
    abort();
  }
  uv_fs_req_cleanup(&open_req1);
  auVar3 = uv_buf_init(test_buf,0xd);
  iovs[0].base = auVar3._8_8_;
  uStack_38 = auVar3._0_8_;
  iovs._8_16_ = uv_buf_init(test_buf2,0xf);
  iVar1 = uv_fs_write(0,&write_req,open_req1.result & 0xffffffff,&stack0xffffffffffffffc8,2,0,0);
  if (iVar1 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xbd4,"r >= 0");
    abort();
  }
  if (write_req.result < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xbd5,"write_req.result >= 0");
    abort();
  }
  uv_fs_req_cleanup(&write_req);
  iVar1 = uv_fs_close(0,&close_req,open_req1.result & 0xffffffff);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xbd9,"r == 0");
    abort();
  }
  if (close_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xbda,"close_req.result == 0");
    abort();
  }
  uv_fs_req_cleanup(&close_req);
  iVar1 = uv_fs_open(0,&open_req1,"test_file",add_flags,0);
  if (iVar1 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xbdf,"r >= 0");
    abort();
  }
  if (open_req1.result < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xbe0,"open_req1.result >= 0");
    abort();
  }
  uv_fs_req_cleanup(&open_req1);
  memset(buf,0,0x20);
  memset(buf2,0,0x20);
  auVar3 = uv_buf_init(buf,0xd);
  iovs[0].base = auVar3._8_8_;
  uStack_38 = auVar3._0_8_;
  auVar3 = uv_buf_init(buf2,0xf);
  iovs._8_16_ = auVar3;
  _Var2 = lseek64((int)open_req1.result,0,1);
  if (_Var2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xbe8,"lseek(open_req1.result, 0, SEEK_CUR) == 0");
    abort();
  }
  iVar1 = uv_fs_read(0,&read_req,open_req1.result & 0xffffffff,&stack0xffffffffffffffc8,2,
                     0xffffffffffffffff,0);
  if (iVar1 < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xbea,"r >= 0");
    abort();
  }
  if (read_req.result != 0x1c) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xbeb,"read_req.result == sizeof(test_buf) + sizeof(test_buf2)");
    abort();
  }
  iVar1 = strcmp(buf,test_buf);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xbec,"strcmp(buf, test_buf) == 0");
    abort();
  }
  iVar1 = strcmp(buf2,test_buf2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xbed,"strcmp(buf2, test_buf2) == 0");
    abort();
  }
  uv_fs_req_cleanup(&read_req);
  iov = (uv_buf_t)uv_buf_init(buf,0x20);
  iVar1 = uv_fs_read(0,&read_req,open_req1.result & 0xffffffff,&iov,1,0xffffffffffffffff,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xbf2,"r == 0");
    abort();
  }
  if (read_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xbf3,"read_req.result == 0");
    abort();
  }
  uv_fs_req_cleanup(&read_req);
  auVar3 = uv_buf_init(buf,0xd);
  iovs[0].base = auVar3._8_8_;
  uStack_38 = auVar3._0_8_;
  auVar3 = uv_buf_init(buf2,0xf);
  iovs._8_16_ = auVar3;
  iVar1 = uv_fs_read(0,&read_req,open_req1.result & 0xffffffff,&stack0xffffffffffffffc8,2,0,0);
  if (-1 < iVar1) {
    if (read_req.result == 0xd) {
      uv_fs_req_cleanup(&read_req);
      iVar1 = uv_fs_read(0,&read_req,open_req1.result & 0xffffffff,&iovs[0].len,1,read_req.result,0)
      ;
      if (iVar1 < 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
                ,0xbff,"r >= 0");
        abort();
      }
      if (read_req.result != 0xf) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
                ,0xc00,"read_req.result == sizeof(test_buf2)");
        abort();
      }
    }
    else if (read_req.result != 0x1c) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xc02,"read_req.result == sizeof(test_buf) + sizeof(test_buf2)");
      abort();
    }
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xc04,"strcmp(buf, test_buf) == 0");
      abort();
    }
    iVar1 = strcmp(buf2,test_buf2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xc05,"strcmp(buf2, test_buf2) == 0");
      abort();
    }
    uv_fs_req_cleanup(&read_req);
    uVar4 = (uv_buf_t)uv_buf_init(buf,0x20);
    iov = uVar4;
    iVar1 = uv_fs_read(0,&read_req,open_req1.result & 0xffffffff,&iov,1,0x1c,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xc0b,"r == 0");
      abort();
    }
    if (read_req.result != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xc0c,"read_req.result == 0");
      abort();
    }
    uv_fs_req_cleanup(&read_req);
    iVar1 = uv_fs_close(0,&close_req,open_req1.result & 0xffffffff);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
              ,0xc10,"r == 0");
      abort();
    }
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xc11,"close_req.result == 0");
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,0xbfa,"r >= 0");
  abort();
}

Assistant:

static void fs_write_multiple_bufs(int add_flags) {
  uv_buf_t iovs[2];
  int r;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &open_req1, "test_file",
      O_WRONLY | O_CREAT | add_flags, S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iovs[0] = uv_buf_init(test_buf, sizeof(test_buf));
  iovs[1] = uv_buf_init(test_buf2, sizeof(test_buf2));
  r = uv_fs_write(NULL, &write_req, open_req1.result, iovs, 2, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(write_req.result >= 0);
  uv_fs_req_cleanup(&write_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDONLY | add_flags, 0,
      NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  memset(buf, 0, sizeof(buf));
  memset(buf2, 0, sizeof(buf2));
  /* Read the strings back to separate buffers. */
  iovs[0] = uv_buf_init(buf, sizeof(test_buf));
  iovs[1] = uv_buf_init(buf2, sizeof(test_buf2));
  ASSERT(lseek(open_req1.result, 0, SEEK_CUR) == 0);
  r = uv_fs_read(NULL, &read_req, open_req1.result, iovs, 2, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(read_req.result == sizeof(test_buf) + sizeof(test_buf2));
  ASSERT(strcmp(buf, test_buf) == 0);
  ASSERT(strcmp(buf2, test_buf2) == 0);
  uv_fs_req_cleanup(&read_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  /* Read the strings back to separate buffers. */
  iovs[0] = uv_buf_init(buf, sizeof(test_buf));
  iovs[1] = uv_buf_init(buf2, sizeof(test_buf2));
  r = uv_fs_read(NULL, &read_req, open_req1.result, iovs, 2, 0, NULL);
  ASSERT(r >= 0);
  if (read_req.result == sizeof(test_buf)) {
    /* Infer that preadv is not available. */
    uv_fs_req_cleanup(&read_req);
    r = uv_fs_read(NULL, &read_req, open_req1.result, &iovs[1], 1, read_req.result, NULL);
    ASSERT(r >= 0);
    ASSERT(read_req.result == sizeof(test_buf2));
  } else {
    ASSERT(read_req.result == sizeof(test_buf) + sizeof(test_buf2));
  }
  ASSERT(strcmp(buf, test_buf) == 0);
  ASSERT(strcmp(buf2, test_buf2) == 0);
  uv_fs_req_cleanup(&read_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1,
                 sizeof(test_buf) + sizeof(test_buf2), NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
}